

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectionalAtom.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::DirectionalAtom::getGrad
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,DirectionalAtom *this)

{
  double *pdVar1;
  double dVar2;
  DataStoragePointer DVar3;
  Snapshot *pSVar4;
  double dVar5;
  long lVar6;
  int j;
  pointer pdVar7;
  long lVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double local_130 [3];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  double local_b8 [4];
  double local_98 [4];
  Vector3<double> local_78;
  RotMat3x3d local_60;
  
  pdVar7 = (pointer)operator_new(0x30);
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = pdVar7;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = pdVar7 + 6;
  *pdVar7 = 0.0;
  pdVar7[1] = 0.0;
  pdVar7[2] = 0.0;
  pdVar7[3] = 0.0;
  pdVar7[4] = 0.0;
  pdVar7[5] = 0.0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = pdVar7 + 6;
  DVar3 = (this->super_Atom).super_StuntDouble.storage_;
  pSVar4 = ((this->super_Atom).super_StuntDouble.snapshotMan_)->currentSnapshot_;
  lVar8 = *(long *)((long)&(pSVar4->atomData).force.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + DVar3);
  lVar6 = (long)(this->super_Atom).super_StuntDouble.localIndex_ * 0x18;
  local_98[2] = *(double *)(lVar8 + 0x10 + lVar6);
  pdVar1 = (double *)(lVar8 + lVar6);
  local_98[0] = *pdVar1;
  local_98[1] = pdVar1[1];
  lVar8 = *(long *)((long)&(pSVar4->atomData).torque.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + DVar3);
  pdVar1 = (double *)(lVar8 + lVar6);
  local_b8[0] = *pdVar1;
  local_b8[1] = pdVar1[1];
  local_b8[2] = *(double *)(lVar8 + 0x10 + lVar6);
  StuntDouble::getA(&local_60,(StuntDouble *)this);
  SquareMatrix3<double>::toEulerAngles(&local_78,&local_60);
  dVar5 = cos(local_78.super_Vector<double,_3U>.data_[0]);
  local_108._8_4_ = extraout_XMM0_Dc;
  local_108._0_8_ = dVar5;
  local_108._12_4_ = extraout_XMM0_Dd;
  dVar5 = sin(local_78.super_Vector<double,_3U>.data_[0]);
  dVar9 = cos(local_78.super_Vector<double,_3U>.data_[1]);
  local_118._8_4_ = extraout_XMM0_Dc_00;
  local_118._0_8_ = dVar9;
  local_118._12_4_ = extraout_XMM0_Dd_00;
  dVar9 = sin(local_78.super_Vector<double,_3U>.data_[1]);
  auVar10._0_8_ =
       ~-(ulong)(ABS(dVar9) < 1e-09) & (ulong)dVar9 |
       -(ulong)(ABS(dVar9) < 1e-09) & 0x3e112e0be826d695;
  auVar12._0_8_ = -dVar5 * (double)local_118._0_8_;
  auVar12._8_8_ = (double)local_108._0_8_ * (double)local_118._0_8_;
  auVar10._8_8_ = auVar10._0_8_;
  local_d8 = divpd(auVar12,auVar10);
  local_c8 = 0x3ff0000000000000;
  local_130[0] = (double)local_108._0_8_;
  local_130[1] = dVar5;
  lVar8 = 0;
  local_130[2] = 0.0;
  auVar13._8_8_ = -(double)local_108._0_8_;
  auVar13._0_8_ = dVar5;
  local_f8 = divpd(auVar13,auVar10);
  local_e8 = 0;
  do {
    pdVar7[lVar8] = -local_98[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  dVar9 = pdVar7[3];
  dVar11 = pdVar7[4];
  dVar5 = pdVar7[5];
  lVar8 = 0;
  do {
    dVar2 = local_b8[lVar8];
    dVar9 = dVar9 - *(double *)(local_d8 + lVar8 * 8) * dVar2;
    dVar11 = dVar11 - local_130[lVar8] * dVar2;
    dVar5 = dVar5 - dVar2 * *(double *)(local_f8 + lVar8 * 8);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  pdVar7[3] = dVar9;
  pdVar7[4] = dVar11;
  pdVar7[5] = dVar5;
  return __return_storage_ptr__;
}

Assistant:

std::vector<RealType> DirectionalAtom::getGrad() {
    std::vector<RealType> grad(6, 0.0);
    Vector3d force;
    Vector3d torque;
    Vector3d myEuler;
    RealType phi, theta;
    RealType cphi, sphi, ctheta, stheta;
    Vector3d ephi;
    Vector3d etheta;
    Vector3d epsi;

    force  = getFrc();
    torque = getTrq();

    myEuler = getA().toEulerAngles();

    phi   = myEuler[0];
    theta = myEuler[1];

    cphi   = cos(phi);
    sphi   = sin(phi);
    ctheta = cos(theta);
    stheta = sin(theta);

    if (fabs(stheta) < 1.0E-9) { stheta = 1.0E-9; }

    ephi[0] = -sphi * ctheta / stheta;
    ephi[1] = cphi * ctheta / stheta;
    ephi[2] = 1.0;

    etheta[0] = cphi;
    etheta[1] = sphi;
    etheta[2] = 0.0;

    epsi[0] = sphi / stheta;
    epsi[1] = -cphi / stheta;
    epsi[2] = 0.0;

    // gradient is equal to -force
    for (int j = 0; j < 3; j++)
      grad[j] = -force[j];

    for (int j = 0; j < 3; j++) {
      grad[3] -= torque[j] * ephi[j];
      grad[4] -= torque[j] * etheta[j];
      grad[5] -= torque[j] * epsi[j];
    }

    return grad;
  }